

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O1

void __thiscall
wallet::CWallet::WalletLogPrintf<unsigned_int,unsigned_char,std::__cxx11::string>
          (CWallet *this,char *fmt,uint parameters,uchar parameters_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2)

{
  string_view source_file;
  tinyformat *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Logger *pLVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uchar *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  allocator<char> local_13a;
  uchar local_139;
  undefined1 local_138 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  tinyformat *local_f0;
  size_type local_e8;
  size_type local_e0;
  undefined8 uStack_d8;
  undefined8 local_90;
  char *pcStack_88;
  string local_70;
  char *local_50;
  size_t local_48;
  char local_40;
  undefined7 uStack_3f;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_139 = parameters_1;
  local_138._0_4_ = parameters;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,fmt,&local_13a);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_110,0,0,"%s ",3);
  local_f0 = (tinyformat *)(pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if (local_f0 == (tinyformat *)paVar4) {
    local_e0 = paVar4->_M_allocated_capacity;
    uStack_d8 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_f0 = (tinyformat *)&local_e0;
  }
  else {
    local_e0 = paVar4->_M_allocated_capacity;
  }
  this_00 = local_f0;
  local_e8 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  GetDisplayName_abi_cxx11_((string *)(local_138 + 8),this);
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar3);
  if (bVar1) {
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    tinyformat::format<std::__cxx11::string,unsigned_int,unsigned_char,std::__cxx11::string>
              (&local_70,this_00,local_138 + 8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
               (uint *)&local_139,in_R8,in_stack_fffffffffffffe98);
    WalletLogPrintf<unsigned_int,unsigned_char,std::__cxx11::string>();
    pLVar3 = LogInstance();
    local_90 = 0x58;
    pcStack_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_len = 0x58;
    str._M_str = local_50;
    str._M_len = local_48;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x3a4,ALL,Info);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._8_8_ != &local_120) {
    operator_delete((void *)local_138._8_8_,local_120._M_allocated_capacity + 1);
  }
  if (local_f0 != (tinyformat *)&local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), GetDisplayName(), parameters...);
    }